

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkPointSpline.cpp
# Opt level: O2

void __thiscall chrono::ChLinkPointSpline::UpdateTime(ChLinkPointSpline *this,double time)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  ChMarker *pCVar7;
  element_type *peVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [64];
  undefined1 auVar16 [64];
  double dVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  Vector ptang2;
  double mu;
  ChMatrix33<double> mw;
  double local_220;
  ChVector<double> local_218;
  double local_200;
  double local_1f8;
  double dStack_1f0;
  double local_1e8;
  ChVector<double> local_1d8;
  ChVector<double> local_1b8;
  undefined1 local_198 [64];
  ChVector<double> local_158;
  double local_140;
  ChMatrix33<double> local_138;
  ChMatrix33<double> local_e8;
  ChVector<double> local_98;
  ChQuaternion<double> local_78;
  Coordsys local_58;
  undefined1 auVar15 [64];
  
  (this->super_ChLinkLockLock).super_ChLinkLock.super_ChLinkMarkers.super_ChLink.super_ChLinkBase.
  super_ChPhysicsItem.super_ChObj.ChTime = time;
  if ((this->trajectory_line).
      super___shared_ptr<chrono::geometry::ChLine,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)0x0) {
    local_1b8.m_data[2] = 0.0;
    local_1e8 = 0.0;
    local_218.m_data[2] = 0.0;
    local_158.m_data[2] = 0.0;
    local_1b8.m_data[0] = 0.0;
    local_1b8.m_data[1] = 0.0;
    local_1f8 = 0.0;
    dStack_1f0 = 0.0;
    local_218.m_data[0] = 0.0;
    local_218.m_data[1] = 0.0;
    local_158.m_data[0] = 0.0;
    local_158.m_data[1] = 0.0;
    local_1d8.m_data[0] = 0.0;
    local_1d8.m_data[1] = 0.0;
    local_1d8.m_data[2] = 0.0;
    pCVar7 = (this->super_ChLinkLockLock).super_ChLinkLock.super_ChLinkMarkers.marker1;
    if (&(pCVar7->abs_frame).super_ChFrame<double>.coord != (ChCoordsys<double> *)&local_1d8) {
      local_1d8.m_data[0] = (pCVar7->abs_frame).super_ChFrame<double>.coord.pos.m_data[0];
      local_1d8.m_data[1] = (pCVar7->abs_frame).super_ChFrame<double>.coord.pos.m_data[1];
      local_1d8.m_data[2] = (pCVar7->abs_frame).super_ChFrame<double>.coord.pos.m_data[2];
    }
    ChFrame<double>::TransformPointParentToLocal
              ((ChVector<double> *)&local_e8,
               (ChFrame<double> *)
               (this->super_ChLinkLockLock).super_ChLinkLock.super_ChLinkMarkers.super_ChLink.Body2,
               &local_1d8);
    local_1d8.m_data[0] =
         local_e8.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
    local_1d8.m_data[1] =
         local_e8.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1];
    local_1d8.m_data[2] =
         local_e8.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
    geometry::ChLine::FindNearestLinePoint
              ((this->trajectory_line).
               super___shared_ptr<chrono::geometry::ChLine,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
               &local_1d8,&local_140,0.0,this->tolerance);
    peVar8 = (this->trajectory_line).
             super___shared_ptr<chrono::geometry::ChLine,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_198._0_8_ = local_140;
    (*(peVar8->super_ChGeometry)._vptr_ChGeometry[0xb])(peVar8,&local_1b8);
    peVar8 = (this->trajectory_line).
             super___shared_ptr<chrono::geometry::ChLine,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    auVar1._8_8_ = 0;
    auVar1._0_8_ = local_198._0_8_;
    auVar1 = vmaxsd_avx(ZEXT816(0) << 0x40,auVar1);
    (*(peVar8->super_ChGeometry)._vptr_ChGeometry[0xc])(auVar1._0_8_,peVar8,&local_218);
    peVar8 = (this->trajectory_line).
             super___shared_ptr<chrono::geometry::ChLine,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    auVar18._8_8_ = 0;
    auVar18._0_8_ = local_140 + 0.0001;
    auVar1 = vminsd_avx(ZEXT816(0x3ff0000000000000),auVar18);
    local_198._0_8_ = auVar1._0_8_;
    (*(peVar8->super_ChGeometry)._vptr_ChGeometry[0xb])(peVar8,&local_1f8);
    peVar8 = (this->trajectory_line).
             super___shared_ptr<chrono::geometry::ChLine,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    (*(peVar8->super_ChGeometry)._vptr_ChGeometry[0xc])(local_198._0_8_,peVar8,&local_158);
    Vnorm<double>((ChVector<double> *)&local_e8,&local_218);
    local_218.m_data[0] =
         local_e8.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
    local_218.m_data[1] =
         local_e8.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1];
    local_218.m_data[2] =
         local_e8.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
    Vnorm<double>((ChVector<double> *)&local_e8,&local_158);
    auVar27._8_8_ = 0;
    auVar27._0_8_ = local_218.m_data[2];
    auVar9._8_8_ = local_218.m_data[1];
    auVar9._0_8_ = local_218.m_data[0];
    auVar2._8_8_ = 0;
    auVar2._0_8_ = local_e8.super_Matrix<double,_3,_3,_1,_3,_3>.
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                   array[1];
    auVar29._8_8_ = 0;
    auVar29._0_8_ =
         local_e8.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2] *
         local_218.m_data[1];
    auVar2 = vfmsub231sd_fma(auVar29,auVar27,auVar2);
    auVar1 = vunpcklpd_avx(auVar27,auVar9);
    local_158.m_data[0] =
         local_e8.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
    local_158.m_data[1] =
         local_e8.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1];
    local_158.m_data[2] =
         local_e8.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
    auVar23._8_8_ =
         local_e8.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
    auVar23._0_8_ =
         local_e8.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
    auVar19._0_8_ =
         auVar1._0_8_ *
         local_e8.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
    auVar19._8_8_ =
         auVar1._8_8_ *
         local_e8.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1];
    auVar1 = vfmsub213pd_fma(auVar23,auVar9,auVar19);
    local_98.m_data[0] = auVar2._0_8_;
    local_98.m_data[1] = auVar1._0_8_;
    local_98.m_data[2] = auVar1._8_8_;
    dVar17 = ChVector<double>::Length(&local_98);
    if (1e-07 <= dVar17) {
      ChVector<double>::Normalize(&local_98);
      auVar24._8_8_ = 0;
      auVar24._0_8_ = local_218.m_data[0];
      auVar30._8_8_ = local_218.m_data[2];
      auVar30._0_8_ = local_218.m_data[2];
      auVar21._8_8_ = 0;
      auVar21._0_8_ = local_98.m_data[0];
      auVar32._8_8_ = local_98.m_data[2];
      auVar32._0_8_ = local_98.m_data[2];
      auVar10._8_8_ = local_218.m_data[2];
      auVar10._0_8_ = local_218.m_data[1];
      auVar13._8_8_ = local_98.m_data[2];
      auVar13._0_8_ = local_98.m_data[1];
      auVar1 = vunpcklpd_avx(auVar30,auVar24);
      auVar2 = vunpcklpd_avx(auVar32,auVar21);
      auVar31._0_8_ = local_98.m_data[1] * auVar1._0_8_;
      auVar31._8_8_ = local_98.m_data[2] * auVar1._8_8_;
      auVar22._8_8_ = 0;
      auVar22._0_8_ = local_98.m_data[0] * local_218.m_data[1];
      auVar1 = vfmsub231sd_fma(auVar22,auVar24,auVar13);
      local_138.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array._0_16_ =
           vfmsub213pd_fma(auVar2,auVar10,auVar31);
      local_138.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2] =
           auVar1._0_8_;
      Vnorm<double>((ChVector<double> *)&local_e8,(ChVector<double> *)&local_138);
      local_198 = ZEXT1664((undefined1  [16])
                           local_e8.super_Matrix<double,_3,_3,_1,_3,_3>.
                           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                           m_data.array._0_16_);
      auVar3._8_8_ = 0;
      auVar3._0_8_ = local_218.m_data[2];
      auVar14 = vbroadcastsd_avx512f(auVar3);
      local_200 = local_e8.super_Matrix<double,_3,_3,_1,_3,_3>.
                  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                  array[1];
      auVar14 = vpermi2pd_avx512f(_DAT_00e82040,
                                  ZEXT2464(CONCAT816(auVar14._16_8_,
                                                     CONCAT88(local_218.m_data[1],
                                                              local_218.m_data[0]))),
                                  ZEXT1664(CONCAT88(local_98.m_data[1],local_98.m_data[0])));
      auVar4._8_8_ = 0;
      auVar4._0_8_ = local_98.m_data[2];
      auVar15 = vbroadcastsd_avx512f(auVar4);
      auVar16._0_40_ = auVar14._0_40_;
      auVar16._40_8_ = auVar15._40_8_;
      auVar16._48_8_ = auVar14._48_8_;
      auVar16._56_8_ = auVar14._56_8_;
      local_220 = local_e8.super_Matrix<double,_3,_3,_1,_3,_3>.
                  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                  array[2];
      auVar14 = vpermi2pd_avx512f(_DAT_00e82080,auVar16,local_198);
      local_e8.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8] =
           local_e8.super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
      local_e8.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array._0_64_ =
           auVar14;
    }
    else {
      auVar20._0_8_ = DAT_011dd430 ^ 0x8000000000000000;
      auVar20._8_8_ = 0x8000000000000000;
      local_138.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] =
           (double)(DAT_011dd428 ^ 0x8000000000000000);
      local_138.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] =
           (double)(VECT_Z ^ 0x8000000000000000);
      local_138.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2] =
           (double)vmovlpd_avx(auVar20);
      ChMatrix33<double>::Set_A_Xdir(&local_e8,&local_218,(ChVector<double> *)&local_138);
      local_200 = 0.0;
      local_198 = ZEXT1664(ZEXT816(0));
      local_220 = 0.0;
    }
    ChMatrix33<double>::Get_A_quaternion(&local_78,&local_e8);
    ChFrame<double>::TransformPointLocalToParent
              ((ChVector<double> *)&local_138,
               (ChFrame<double> *)
               (this->super_ChLinkLockLock).super_ChLinkLock.super_ChLinkMarkers.super_ChLink.Body2,
               &local_1b8);
    local_1b8.m_data[0] =
         local_138.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
    local_1b8.m_data[1] =
         local_138.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1];
    local_1b8.m_data[2] =
         local_138.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
    ChQuaternion<double>::operator*
              ((ChQuaternion<double> *)&local_138,
               &(((this->super_ChLinkLockLock).super_ChLinkLock.super_ChLinkMarkers.super_ChLink.
                 Body2)->super_ChFrameMoving<double>).super_ChFrame<double>.coord.rot,&local_78);
    local_58.pos.m_data[0] = local_1b8.m_data[0];
    local_58.pos.m_data[1] = local_1b8.m_data[1];
    local_58.pos.m_data[2] = local_1b8.m_data[2];
    local_78.m_data[0] =
         local_138.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
    local_78.m_data[1] =
         local_138.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1];
    local_78.m_data[2] =
         local_138.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
    local_78.m_data[3] =
         local_138.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3];
    local_58.rot.m_data[0] =
         local_138.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
    local_58.rot.m_data[1] =
         local_138.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1];
    local_58.rot.m_data[2] =
         local_138.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
    local_58.rot.m_data[3] =
         local_138.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3];
    ChMarker::Impose_Abs_Coord
              ((this->super_ChLinkLockLock).super_ChLinkLock.super_ChLinkMarkers.marker2,&local_58);
    ((this->super_ChLinkLockLock).super_ChLinkLock.super_ChLinkMarkers.marker2)->motion_type =
         M_MOTION_EXTERNAL;
    auVar12._8_8_ = local_1b8.m_data[1];
    auVar12._0_8_ = local_1b8.m_data[0];
    auVar11._8_8_ = dStack_1f0;
    auVar11._0_8_ = local_1f8;
    local_138.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array._0_16_ =
         vsubpd_avx(auVar12,auVar11);
    local_138.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2] =
         local_1b8.m_data[2] - local_1e8;
    dVar17 = ChVector<double>::Length((ChVector<double> *)&local_138);
    auVar5._8_8_ = 0;
    auVar5._0_8_ = local_198._0_8_;
    auVar25._8_8_ = 0;
    auVar25._0_8_ = local_1f8 - local_1b8.m_data[0];
    auVar28._8_8_ = 0;
    auVar28._0_8_ = (dStack_1f0 - local_1b8.m_data[1]) * local_200;
    auVar1 = vfmadd231sd_fma(auVar28,auVar25,auVar5);
    local_198._0_8_ = dVar17 * dVar17;
    auVar6._8_8_ = 0;
    auVar6._0_8_ = local_220;
    auVar26._8_8_ = 0;
    auVar26._0_8_ = local_1e8 - local_1b8.m_data[2];
    auVar1 = vfmadd132sd_fma(auVar26,auVar1,auVar6);
    ChMatrix33<double>::Set_A_quaternion
              (&local_138,
               &(((this->super_ChLinkLockLock).super_ChLinkLock.super_ChLinkMarkers.marker2)->
                abs_frame).super_ChFrame<double>.coord.rot);
    dVar17 = DAT_011dd3e0;
    if (this != (ChLinkPointSpline *)(sBulletDNAstr64 + 0x2880)) {
      (this->super_ChLinkLockLock).deltaC.pos.m_data[0] = VNULL;
      (this->super_ChLinkLockLock).deltaC.pos.m_data[1] = dVar17;
      (this->super_ChLinkLockLock).deltaC.pos.m_data[2] = DAT_011dd3e8;
    }
    dVar17 = DAT_011dd3e0;
    if (this != (ChLinkPointSpline *)(sBulletDNAstr64 + 0x2848)) {
      (this->super_ChLinkLockLock).deltaC_dt.pos.m_data[0] = VNULL;
      (this->super_ChLinkLockLock).deltaC_dt.pos.m_data[1] = dVar17;
      (this->super_ChLinkLockLock).deltaC_dt.pos.m_data[2] = DAT_011dd3e8;
    }
    (this->super_ChLinkLockLock).deltaC_dtdt.pos.m_data[0] = 0.0;
    (this->super_ChLinkLockLock).deltaC_dtdt.pos.m_data[1] = 0.0;
    dVar17 = (this->super_ChLinkLockLock).super_ChLinkLock.super_ChLinkMarkers.relM_dt.pos.m_data[0]
    ;
    (this->super_ChLinkLockLock).deltaC_dtdt.pos.m_data[2] =
         (dVar17 * dVar17) / ((double)local_198._0_8_ / (auVar1._0_8_ + auVar1._0_8_));
    ChQuaternion<double>::operator=
              (&(this->super_ChLinkLockLock).deltaC.rot,(ChQuaternion<double> *)&QUNIT);
    ChQuaternion<double>::operator=
              (&(this->super_ChLinkLockLock).deltaC_dt.rot,(ChQuaternion<double> *)QNULL);
    ChQuaternion<double>::operator=
              (&(this->super_ChLinkLockLock).deltaC_dtdt.rot,(ChQuaternion<double> *)QNULL);
  }
  return;
}

Assistant:

void ChLinkPointSpline::UpdateTime(double time) {
    ChTime = time;

    if (trajectory_line) {
        Vector param, ptang, ptang2, vdir, vdir2, vnorm, vrad, vpoint;
        double mu, ds, dh, mrad;

        // find nearest point
        vpoint = marker1->GetAbsCoord().pos;
        vpoint = Body2->TransformPointParentToLocal(vpoint);
        trajectory_line->FindNearestLinePoint(vpoint, mu, 0, tolerance);

        param.y() = 0;
        param.z() = 0;
        param.x() = mu;
        trajectory_line->Evaluate(ptang, param.x());

        if (param.x() < 0)
            param.x() = 0;
        trajectory_line->Derive(vdir, param.x());

        param.x() = mu + BDF_STEP_HIGH;
        if (param.x() > 1)
            param.x() = 1;
        trajectory_line->Evaluate(ptang2, param.x());

        trajectory_line->Derive(vdir2, param.x());

        ChMatrix33<> ma;

        vdir = Vnorm(vdir);
        vdir2 = Vnorm(vdir2);
        vnorm = Vcross(vdir2, vdir);
        if (vnorm.Length() < 1e-7) {
            // on a straight segment, no curvature, so define normal and radial by these:
            ma.Set_A_Xdir(vdir, -VECT_Z);
        } else {
            vnorm.Normalize();
            vrad = Vnorm(Vcross(vdir, vnorm));
            ma.Set_A_axis(vdir, vnorm, vrad);
        }
        Quaternion qabsdir = ma.Get_A_quaternion();

        ptang = Body2->TransformPointLocalToParent(ptang);
        qabsdir = Body2->GetRot() * qabsdir;

        Coordsys newmarkpos;
        newmarkpos.pos = ptang;
        newmarkpos.rot = qabsdir;
        marker2->Impose_Abs_Coord(newmarkpos);  // move "main" marker2 into tangent position
        marker2->SetMotionType(
            ChMarker::M_MOTION_EXTERNAL);  // the BDF routine won't handle speed and acc.calculus of the moved marker!

        ds = Vlength(Vsub(ptang, ptang2));
        dh = Vdot(Vsub(ptang2, ptang), vrad);
        mrad = ((ds * ds) / (2 * dh));  // radius of curvature on spline

        ChMatrix33<> mw;
        mw.Set_A_quaternion(marker2->GetAbsCoord().rot);

        deltaC.pos = VNULL;
        deltaC_dt.pos = VNULL;
        deltaC_dtdt.pos.x() = 0;  // csys X axis aligned to vdir: just
        deltaC_dtdt.pos.y() = 0;  // impose centripetal acceleration
        // deltaC_dtdt.pos.z() =   pow(Vdot(this->GetRelM_dt().pos, vdir), 2) / mrad;
        deltaC_dtdt.pos.z() = pow(GetRelM_dt().pos.x(), 2) / mrad;

        deltaC.rot = QUNIT;
        deltaC_dt.rot = QNULL;
        deltaC_dtdt.rot = QNULL;
    }
}